

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O3

int __thiscall anon_unknown.dwarf_26d854::OSScapture::recordProc(OSScapture *this)

{
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  char *pcVar6;
  ALCdevice *pAVar7;
  char *msg;
  ll_ringbuffer_data_pair vec;
  pollfd local_60;
  int *local_58;
  void *local_50;
  long local_48;
  
  SetRTPriority();
  althrd_setname("alsoft-record");
  pAVar7 = (this->super_BackendBase).mDevice;
  uVar1 = BytesFromDevFmt(pAVar7->FmtType);
  uVar2 = ChannelsFromDevFmt(pAVar7->FmtChans,pAVar7->mAmbiOrder);
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    do {
      local_60.events = 1;
      local_60.revents = 0;
      local_60.fd = this->mFd;
      iVar3 = poll(&local_60,1,1000);
      if (iVar3 < 0) {
        piVar5 = __errno_location();
        __stream = gLogFile;
        iVar3 = *piVar5;
        if ((iVar3 != 4) && (iVar3 != 0xb)) {
          if (0 < (int)gLogLevel) {
            pcVar6 = strerror(iVar3);
            fprintf((FILE *)__stream,"[ALSOFT] (EE) poll failed: %s\n",pcVar6);
            iVar3 = *piVar5;
          }
          pAVar7 = (this->super_BackendBase).mDevice;
          pcVar6 = strerror(iVar3);
          msg = "Failed to check capture samples: %s";
LAB_00164ef1:
          ALCdevice::handleDisconnect(pAVar7,msg,pcVar6);
          return 0;
        }
      }
      else if (iVar3 == 0) {
        if (1 < (int)gLogLevel) {
          _GLOBAL__N_1::OSScapture::recordProc();
        }
      }
      else {
        RingBuffer::getWriteVector
                  ((this->mRing)._M_t.
                   super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                   super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                   super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl);
        if (local_48 != 0) {
          uVar4 = read(this->mFd,local_50,local_48 * (ulong)(uVar2 * uVar1));
          if ((long)uVar4 < 0) {
            if ((int)gLogLevel < 1) {
              local_58 = __errno_location();
            }
            else {
              _GLOBAL__N_1::OSScapture::recordProc((OSScapture *)&local_58);
            }
            pAVar7 = (this->super_BackendBase).mDevice;
            pcVar6 = strerror(*local_58);
            msg = "Failed reading capture samples: %s";
            goto LAB_00164ef1;
          }
          RingBuffer::writeAdvance
                    ((this->mRing)._M_t.
                     super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                     super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                     super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl,
                     (uVar4 & 0xffffffff) / (ulong)(uVar2 * uVar1));
        }
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int OSScapture::recordProc()
{
    SetRTPriority();
    althrd_setname(RECORD_THREAD_NAME);

    const ALuint frame_size{mDevice->frameSizeFromFmt()};
    while(!mKillNow.load(std::memory_order_acquire))
    {
        pollfd pollitem{};
        pollitem.fd = mFd;
        pollitem.events = POLLIN;

        int sret{poll(&pollitem, 1, 1000)};
        if(sret < 0)
        {
            if(errno == EINTR || errno == EAGAIN)
                continue;
            ERR("poll failed: %s\n", strerror(errno));
            mDevice->handleDisconnect("Failed to check capture samples: %s", strerror(errno));
            break;
        }
        else if(sret == 0)
        {
            WARN("poll timeout\n");
            continue;
        }

        auto vec = mRing->getWriteVector();
        if(vec.first.len > 0)
        {
            ssize_t amt{read(mFd, vec.first.buf, vec.first.len*frame_size)};
            if(amt < 0)
            {
                ERR("read failed: %s\n", strerror(errno));
                mDevice->handleDisconnect("Failed reading capture samples: %s", strerror(errno));
                break;
            }
            mRing->writeAdvance(static_cast<ALuint>(amt)/frame_size);
        }
    }

    return 0;
}